

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_vector.c
# Opt level: O1

exr_result_t
exr_attr_string_vector_add_entry_with_length
          (exr_context_t ctxt,exr_attr_string_vector_t *sv,char *s,int32_t len)

{
  undefined4 *puVar1;
  undefined4 *puVar2;
  int iVar3;
  int iVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  bool bVar8;
  int iVar9;
  exr_result_t eVar10;
  long lVar11;
  long lVar12;
  exr_attr_string_t *unaff_R12;
  
  if (ctxt == (exr_context_t)0x0) {
    eVar10 = 2;
  }
  else {
    if (sv == (exr_attr_string_vector_t *)0x0) {
      eVar10 = (*ctxt->report_error)
                         (ctxt,3,"Invalid reference to string vector object to assign to");
      return eVar10;
    }
    iVar3 = sv->n_strings;
    iVar4 = sv->alloc_size;
    if (iVar3 < iVar4) {
      unaff_R12 = sv->strings;
    }
    else {
      if (iVar4 < 0x7ffffff) {
        iVar9 = iVar3 + 2;
        if (iVar3 < iVar4 * 2) {
          iVar9 = iVar4 * 2;
        }
        unaff_R12 = (exr_attr_string_t *)(*ctxt->alloc_fn)((long)iVar9 << 4);
        if (unaff_R12 == (exr_attr_string_t *)0x0) {
          iVar9 = (*ctxt->standard_error)(ctxt,1);
          unaff_R12 = (exr_attr_string_t *)0x0;
          bVar8 = false;
        }
        else {
          if (0 < sv->n_strings) {
            lVar11 = 0;
            lVar12 = 0;
            do {
              puVar1 = (undefined4 *)((long)&sv->strings->length + lVar11);
              uVar5 = puVar1[1];
              uVar6 = puVar1[2];
              uVar7 = puVar1[3];
              puVar2 = (undefined4 *)((long)&unaff_R12->length + lVar11);
              *puVar2 = *puVar1;
              puVar2[1] = uVar5;
              puVar2[2] = uVar6;
              puVar2[3] = uVar7;
              lVar12 = lVar12 + 1;
              lVar11 = lVar11 + 0x10;
            } while (lVar12 < sv->n_strings);
          }
          if (0 < sv->alloc_size) {
            (*ctxt->free_fn)(sv->strings);
          }
          sv->strings = unaff_R12;
          sv->alloc_size = iVar9;
          bVar8 = true;
        }
      }
      else {
        iVar9 = (*ctxt->standard_error)(ctxt,1);
        bVar8 = false;
      }
      if (!bVar8) {
        return iVar9;
      }
    }
    eVar10 = exr_attr_string_create_with_length(ctxt,unaff_R12 + sv->n_strings,s,len);
    if (eVar10 == 0) {
      sv->n_strings = iVar3 + 1;
    }
  }
  return eVar10;
}

Assistant:

exr_result_t
exr_attr_string_vector_add_entry_with_length (
    exr_context_t             ctxt,
    exr_attr_string_vector_t* sv,
    const char*               s,
    int32_t                   len)
{
    int32_t            nent;
    int                rv;
    exr_attr_string_t* nlist;

    if (!ctxt) return EXR_ERR_MISSING_CONTEXT_ARG;

    if (!sv)
        return ctxt->report_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid reference to string vector object to assign to");

    nent = sv->n_strings + 1;
    if (nent > sv->alloc_size)
    {
        size_t  bytes;
        int32_t allsz = sv->alloc_size * 2;

        if (sv->alloc_size >= (INT32_MAX / (int) sizeof (exr_attr_string_t)))
            return ctxt->standard_error (ctxt, EXR_ERR_OUT_OF_MEMORY);

        if (nent > allsz) allsz = nent + 1;
        bytes = ((size_t) allsz) * sizeof (exr_attr_string_t);
        nlist = (exr_attr_string_t*) ctxt->alloc_fn (bytes);
        if (nlist == NULL)
            return ctxt->standard_error (ctxt, EXR_ERR_OUT_OF_MEMORY);

        for (int32_t i = 0; i < sv->n_strings; ++i)
            *(nlist + i) = sv->strings[i];

        if (sv->alloc_size > 0)
            ctxt->free_fn (EXR_CONST_CAST (void*, sv->strings));
        sv->strings    = nlist;
        sv->alloc_size = allsz;
    }
    else
    {
        /* that means we own this and can write into, cast away const */
        nlist = EXR_CONST_CAST (exr_attr_string_t*, sv->strings);
    }

    rv = exr_attr_string_create_with_length (
        ctxt, nlist + sv->n_strings, s, len);
    if (rv == EXR_ERR_SUCCESS) sv->n_strings = nent;
    return rv;
}